

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::DoubleOption::giveRndValue(DoubleOption *this,string *optionText)

{
  double dVar1;
  int iVar2;
  double dVar3;
  ostringstream strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream local_188 [376];
  
  dVar3 = (this->range).begin;
  if ((this->range).begin_inclusive == false) {
    dVar3 = dVar3 + 1e-06;
  }
  iVar2 = rand();
  dVar1 = (this->range).end;
  for (dVar3 = (double)iVar2 + dVar3; dVar1 < dVar3; dVar3 = dVar3 - (dVar1 - (this->range).begin))
  {
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::_M_insert<double>(dVar3);
  std::operator+(&local_1e8,"-",optionText);
  std::operator+(&local_1c8,&local_1e8,"=");
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1a8,&local_1c8,&local_208);
  std::__cxx11::string::operator=((string *)optionText,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        double rndV = range.begin_inclusive ? range.begin : range.begin + 0.000001;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }